

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlDumpElementDecl(xmlBufferPtr buf,xmlElementPtr elem)

{
  xmlFreeFunc p_Var1;
  int iVar2;
  xmlSaveCtxtPtr ctxt;
  xmlChar *pxVar3;
  
  if (elem != (xmlElementPtr)0x0 && buf != (xmlBufferPtr)0x0) {
    ctxt = xmlSaveToBuffer(buf,(char *)0x0,0);
    xmlSaveTree(ctxt,(xmlNodePtr)elem);
    iVar2 = xmlSaveFinish(ctxt);
    p_Var1 = xmlFree;
    if (iVar2 != 0) {
      pxVar3 = xmlBufferDetach(buf);
      (*p_Var1)(pxVar3);
      return;
    }
  }
  return;
}

Assistant:

void
xmlDumpElementDecl(xmlBufferPtr buf, xmlElementPtr elem) {
    xmlSaveCtxtPtr save;

    if ((buf == NULL) || (elem == NULL))
        return;

    save = xmlSaveToBuffer(buf, NULL, 0);
    xmlSaveTree(save, (xmlNodePtr) elem);
    if (xmlSaveFinish(save) != XML_ERR_OK)
        xmlFree(xmlBufferDetach(buf));
}